

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ErrorCheckEndWindowRecover(ImGuiErrorLogCallback log_callback,void *user_data)

{
  ImVector<unsigned_int> *pIVar1;
  int iVar2;
  int iVar3;
  ImGuiTable *pIVar4;
  ImGuiWindow *pIVar5;
  ImGuiWindowStackData *pIVar6;
  ImGuiTabBar *pIVar7;
  char *pcVar8;
  ImGuiContext *pIVar9;
  ImGuiContext *pIVar10;
  char *pcVar11;
  uint uVar12;
  int iVar13;
  
  pIVar9 = GImGui;
  pIVar4 = GImGui->CurrentTable;
  while (pIVar4 != (ImGuiTable *)0x0) {
    if ((pIVar4->OuterWindow != pIVar9->CurrentWindow) &&
       (pIVar4->InnerWindow != pIVar9->CurrentWindow)) break;
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing EndTable() in \'%s\'",
                      pIVar4->OuterWindow->Name);
    }
    EndTable();
    pIVar4 = pIVar9->CurrentTable;
  }
  pIVar5 = pIVar9->CurrentWindow;
  iVar2 = (pIVar9->CurrentWindowStack).Size;
  pIVar6 = (pIVar9->CurrentWindowStack).Data;
  pIVar7 = pIVar9->CurrentTabBar;
  while (pIVar7 != (ImGuiTabBar *)0x0) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing EndTabBar() in \'%s\'",pIVar5->Name);
    }
    EndTabBar();
    pIVar7 = pIVar9->CurrentTabBar;
  }
  iVar3 = (pIVar5->DC).TreeDepth;
  while (0 < iVar3) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing TreePop() in \'%s\'",pIVar5->Name);
    }
    TreePop();
    iVar3 = (pIVar5->DC).TreeDepth;
  }
  if ((int)pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfGroupStack < (pIVar9->GroupStack).Size)
  {
    do {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndGroup() in \'%s\'",pIVar5->Name);
      }
      EndGroup();
    } while ((int)pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfGroupStack <
             (pIVar9->GroupStack).Size);
  }
  iVar3 = (pIVar5->IDStack).Size;
  while (1 < iVar3) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing PopID() in \'%s\'",pIVar5->Name);
    }
    pIVar1 = &GImGui->CurrentWindow->IDStack;
    pIVar1->Size = pIVar1->Size + -1;
    iVar3 = (pIVar5->IDStack).Size;
  }
  if (pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfDisabledStack < pIVar9->DisabledStackSize) {
    do {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndDisabled() in \'%s\'",pIVar5->Name);
      }
      EndDisabled();
    } while (pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfDisabledStack <
             pIVar9->DisabledStackSize);
  }
  while (iVar3 = (pIVar9->ColorStack).Size,
        pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfColorStack < iVar3) {
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      pcVar8 = pIVar5->Name;
      pcVar11 = GetStyleColorName((pIVar9->ColorStack).Data[(long)iVar3 + -1].Col);
      (*log_callback)(user_data,"Recovered from missing PopStyleColor() in \'%s\' for ImGuiCol_%s",
                      pcVar8,pcVar11);
    }
    PopStyleColor(1);
  }
  if ((int)pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfItemFlagsStack <
      (pIVar9->ItemFlagsStack).Size) {
    do {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopItemFlag() in \'%s\'",pIVar5->Name);
      }
      pIVar10 = GImGui;
      iVar3 = (GImGui->ItemFlagsStack).Size;
      (GImGui->ItemFlagsStack).Size = iVar3 + -1;
      pIVar10->CurrentItemFlags = (pIVar10->ItemFlagsStack).Data[(long)iVar3 + -2];
    } while ((int)pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfItemFlagsStack <
             (pIVar9->ItemFlagsStack).Size);
  }
  if ((int)pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfStyleVarStack <
      (pIVar9->StyleVarStack).Size) {
    do {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopStyleVar() in \'%s\'",pIVar5->Name);
      }
      PopStyleVar(1);
    } while ((int)pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfStyleVarStack <
             (pIVar9->StyleVarStack).Size);
  }
  if (pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfFocusScopeStack + 1 <
      (pIVar9->FocusScopeStack).Size) {
    do {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopFocusScope() in \'%s\'",pIVar5->Name);
      }
      pIVar10 = GImGui;
      iVar3 = (GImGui->FocusScopeStack).Size;
      iVar13 = iVar3 + -1;
      (GImGui->FocusScopeStack).Size = iVar13;
      if (iVar13 == 0) {
        uVar12 = 0;
      }
      else {
        uVar12 = (pIVar10->FocusScopeStack).Data[(long)iVar3 + -2];
      }
      pIVar10->CurrentFocusScopeId = uVar12;
    } while (pIVar6[(long)iVar2 + -1].StackSizesOnBegin.SizeOfFocusScopeStack + 1 <
             (pIVar9->FocusScopeStack).Size);
  }
  return;
}

Assistant:

void    ImGui::ErrorCheckEndWindowRecover(ImGuiErrorLogCallback log_callback, void* user_data)
{
    ImGuiContext& g = *GImGui;
    while (g.CurrentTable && (g.CurrentTable->OuterWindow == g.CurrentWindow || g.CurrentTable->InnerWindow == g.CurrentWindow))
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndTable() in '%s'", g.CurrentTable->OuterWindow->Name);
        EndTable();
    }

    ImGuiWindow* window = g.CurrentWindow;
    ImGuiStackSizes* stack_sizes = &g.CurrentWindowStack.back().StackSizesOnBegin;
    IM_ASSERT(window != NULL);
    while (g.CurrentTabBar != NULL) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndTabBar() in '%s'", window->Name);
        EndTabBar();
    }
    while (window->DC.TreeDepth > 0)
    {
        if (log_callback) log_callback(user_data, "Recovered from missing TreePop() in '%s'", window->Name);
        TreePop();
    }
    while (g.GroupStack.Size > stack_sizes->SizeOfGroupStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndGroup() in '%s'", window->Name);
        EndGroup();
    }
    while (window->IDStack.Size > 1)
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopID() in '%s'", window->Name);
        PopID();
    }
    while (g.DisabledStackSize > stack_sizes->SizeOfDisabledStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndDisabled() in '%s'", window->Name);
        EndDisabled();
    }
    while (g.ColorStack.Size > stack_sizes->SizeOfColorStack)
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopStyleColor() in '%s' for ImGuiCol_%s", window->Name, GetStyleColorName(g.ColorStack.back().Col));
        PopStyleColor();
    }
    while (g.ItemFlagsStack.Size > stack_sizes->SizeOfItemFlagsStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopItemFlag() in '%s'", window->Name);
        PopItemFlag();
    }
    while (g.StyleVarStack.Size > stack_sizes->SizeOfStyleVarStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopStyleVar() in '%s'", window->Name);
        PopStyleVar();
    }
    while (g.FocusScopeStack.Size > stack_sizes->SizeOfFocusScopeStack + 1) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopFocusScope() in '%s'", window->Name);
        PopFocusScope();
    }
}